

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O1

ztast_statement_t * ztast_statement_from_assignment(ztast_t *ast,ztast_assignment_t *assignment)

{
  ztast_statement_t *pzVar1;
  
  pzVar1 = (ztast_statement_t *)(*ast->mallocfn)(0x18,ast->opaque);
  if (pzVar1 == (ztast_statement_t *)0x0) {
    pzVar1 = (ztast_statement_t *)0x0;
  }
  else {
    pzVar1->next = (ztast_statement *)0x0;
    pzVar1->type = ZTSTMT_ASSIGNMENT;
    (pzVar1->u).assignment = assignment;
  }
  return pzVar1;
}

Assistant:

ztast_statement_t *ztast_statement_from_assignment(ztast_t            *ast,
                                                   ztast_assignment_t *assignment)
{
  ztast_statement_t *stmt;

  assert(ast);
  assert(assignment);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_statement_from_assignment %p", assignment);
#endif

  stmt = ZTAST_MALLOC(sizeof(*stmt));
  if (stmt == NULL)
    return NULL;

  stmt->next         = NULL;
  stmt->type         = ZTSTMT_ASSIGNMENT;
  stmt->u.assignment = assignment;

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn(" -> %p\n", stmt);
#endif

  return stmt;
}